

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void MergeStyles(TidyDocImpl *doc,Node *node,Node *child)

{
  tmbstr ptVar1;
  AttVal *av_00;
  tmbstr style;
  tmbstr s2;
  tmbstr s1;
  AttVal *av;
  Node *child_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  MergeClasses(doc,node,child);
  style = (tmbstr)0x0;
  for (s1 = (tmbstr)child->attributes; s1 != (tmbstr)0x0; s1 = *(tmbstr *)s1) {
    if (((s1 != (tmbstr)0x0) && (*(long *)(s1 + 8) != 0)) && (**(int **)(s1 + 8) == 0x91)) {
      style = *(tmbstr *)(s1 + 0x30);
      break;
    }
  }
  s2 = (tmbstr)0x0;
  s1 = (tmbstr)node->attributes;
  do {
    if (s1 == (tmbstr)0x0) {
LAB_00166479:
      if (s2 == (tmbstr)0x0) {
        if (style != (tmbstr)0x0) {
          av_00 = prvTidyNewAttributeEx(doc,"style",style,0x22);
          prvTidyInsertAttributeAtStart(node,av_00);
        }
      }
      else if (style != (tmbstr)0x0) {
        ptVar1 = MergeProperties(doc,s2,style);
        (*doc->allocator->vtbl->free)(doc->allocator,*(void **)(s1 + 0x30));
        *(tmbstr *)(s1 + 0x30) = ptVar1;
      }
      return;
    }
    if (((s1 != (tmbstr)0x0) && (*(long *)(s1 + 8) != 0)) && (**(int **)(s1 + 8) == 0x91)) {
      s2 = *(tmbstr *)(s1 + 0x30);
      goto LAB_00166479;
    }
    s1 = *(tmbstr *)s1;
  } while( true );
}

Assistant:

static void MergeStyles(TidyDocImpl* doc, Node *node, Node *child)
{
    AttVal *av;
    tmbstr s1, s2, style;

    /*
       the child may have a class attribute used
       for attaching styles, if so the class name
       needs to be copied to node's class
    */
    MergeClasses(doc, node, child);

    for (s2 = NULL, av = child->attributes; av; av = av->next)
    {
        if (attrIsSTYLE(av))
        {
            s2 = av->value;
            break;
        }
    }

    for (s1 = NULL, av = node->attributes; av; av = av->next)
    {
        if (attrIsSTYLE(av))
        {
            s1 = av->value;
            break;
        }
    }

    if (s1)
    {
        if (s2)  /* merge styles from both */
        {
            style = MergeProperties(doc, s1, s2);
            TidyDocFree(doc, av->value);
            av->value = style;
        }
    }
    else if (s2)  /* copy style of child */
    {
        av = TY_(NewAttributeEx)( doc, "style", s2, '"' );
        TY_(InsertAttributeAtStart)( node, av );
    }
}